

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O1

filepos_t MATROSKA_MetaSeekPosInSegment(matroska_seekpoint *MetaSeek)

{
  ebml_context *peVar1;
  bool_t bVar2;
  ebml_integer *Element;
  int64_t iVar3;
  
  peVar1 = MATROSKA_getContextSeek();
  bVar2 = EBML_ElementIsType((ebml_element *)MetaSeek,peVar1);
  if (bVar2 == 0) {
    __assert_fail("EBML_ElementIsType((ebml_element*)MetaSeek, MATROSKA_getContextSeek())",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x1a6,"filepos_t MATROSKA_MetaSeekPosInSegment(const matroska_seekpoint *)");
  }
  peVar1 = MATROSKA_getContextSeekPosition();
  Element = (ebml_integer *)EBML_MasterFindFirstElt(&MetaSeek->Base,peVar1,0,0,0);
  if (Element != (ebml_integer *)0x0) {
    iVar3 = EBML_IntegerValue(Element);
    return iVar3;
  }
  return -1;
}

Assistant:

filepos_t MATROSKA_MetaSeekPosInSegment(const matroska_seekpoint *MetaSeek)
{
    ebml_integer *SeekPos;
    assert(EBML_ElementIsType((ebml_element*)MetaSeek, MATROSKA_getContextSeek()));
    SeekPos = (ebml_integer*)EBML_MasterFindChild((ebml_master*)MetaSeek, MATROSKA_getContextSeekPosition());
    if (!SeekPos)
        return INVALID_FILEPOS_T;
    return EBML_IntegerValue(SeekPos);
}